

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  anon_union_240_10_26c073a1_for_proto *pp;
  Curl_easy *pCVar2;
  undefined4 *puVar3;
  curl_slist *pcVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  curl_off_t cVar9;
  char *pcVar10;
  undefined1 connected;
  long lVar11;
  char *fmt;
  char *pcVar13;
  _Bool *p_Var12;
  
  *done = false;
  pCVar2 = conn->data;
  pcVar8 = (pCVar2->set).str[6];
  if (pcVar8 == (char *)0x0) {
    CVar5 = CURLE_OK;
  }
  else {
    CVar5 = Curl_urldecode(pCVar2,pcVar8,0,(char **)((long)(pCVar2->req).protop + 8),(size_t *)0x0,
                           true);
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pCVar2 = conn->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  connected = 0xff;
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn->data;
  puVar3 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar3 = 1;
  }
  *done = false;
  pcVar4 = (pCVar2->set).mail_rcpt;
  *(curl_slist **)(puVar3 + 4) = pcVar4;
  *(undefined1 *)(puVar3 + 8) = 1;
  *(undefined8 *)(puVar3 + 6) = 2;
  if ((pCVar2->set).upload == false) {
    if (pcVar4 != (curl_slist *)0x0 && (pCVar2->set).mimepost.kind != MIMEKIND_NONE)
    goto LAB_00135a03;
  }
  else if (pcVar4 != (curl_slist *)0x0) {
LAB_00135a03:
    pcVar8 = (pCVar2->set).str[0x37];
    if (pcVar8 == (char *)0x0) {
      pcVar13 = (*Curl_cstrdup)("<>");
      connected = SUB81(pcVar8,0);
    }
    else {
      if (*pcVar8 == '<') {
        pcVar13 = "%s";
      }
      else {
        pcVar13 = "<%s>";
      }
      pcVar13 = curl_maprintf(pcVar13);
      connected = SUB81(pcVar8,0);
    }
    CVar5 = CURLE_OUT_OF_MEMORY;
    if (pcVar13 == (char *)0x0) goto LAB_00135c90;
    pcVar8 = (pCVar2->set).str[0x38];
    if ((pcVar8 == (char *)0x0) || ((conn->proto).ftpc.cwdcount == 0)) {
      pcVar7 = (char *)0x0;
    }
    else {
      if (*pcVar8 == '\0') {
        pcVar7 = (*Curl_cstrdup)("<>");
        connected = SUB81(pcVar8,0);
      }
      else {
        pcVar7 = curl_maprintf("%s");
        connected = SUB81(pcVar8,0);
      }
      if (pcVar7 == (char *)0x0) {
        (*Curl_cfree)(pcVar13);
        goto LAB_00135c90;
      }
    }
    if ((pCVar2->set).mimepost.kind != MIMEKIND_NONE) {
      part = &(pCVar2->set).mimepost;
      puVar1 = &(pCVar2->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(pCVar2->set).headers,0);
      connected = 0;
      CVar6 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar6 == CURLE_OK) {
        connected = 0x81;
        pcVar8 = Curl_checkheaders(conn,"Mime-Version");
        CVar6 = CURLE_OK;
        if (pcVar8 == (char *)0x0) {
          connected = 0x8e;
          CVar6 = Curl_mime_add_header(&(pCVar2->set).mimepost.curlheaders,"Mime-Version: 1.0");
        }
      }
      if (CVar6 == CURLE_OK) {
        CVar6 = Curl_mime_rewind(part);
      }
      if (CVar6 != CURLE_OK) {
        (*Curl_cfree)(pcVar13);
        (*Curl_cfree)(pcVar7);
        CVar5 = CVar6;
        goto LAB_00135c90;
      }
      cVar9 = Curl_mime_size(part);
      (pCVar2->state).infilesize = cVar9;
      (pCVar2->state).fread_func = Curl_mime_read;
      (pCVar2->state).in = part;
    }
    if (((conn->proto).imapc.resptag[1] == '\x01') &&
       (lVar11 = (pCVar2->state).infilesize, 0 < lVar11)) {
      pcVar8 = curl_maprintf("%ld");
      connected = (undefined1)lVar11;
      if (pcVar8 == (char *)0x0) {
        (*Curl_cfree)(pcVar13);
        (*Curl_cfree)(pcVar7);
        goto LAB_00135c90;
      }
    }
    else {
      pcVar8 = (char *)0x0;
    }
    pp = &conn->proto;
    if (pcVar7 == (char *)0x0 && pcVar8 == (char *)0x0) {
      connected = 0xfa;
      CVar5 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s",pcVar13);
    }
    else {
      if ((pcVar7 == (char *)0x0) || (pcVar8 != (char *)0x0)) {
        if ((pcVar7 != (char *)0x0) && (pcVar8 != (char *)0x0)) {
          connected = 0x1c;
          CVar5 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s SIZE=%s",pcVar13,pcVar7,pcVar8)
          ;
          goto LAB_00135c65;
        }
        fmt = "MAIL FROM:%s SIZE=%s";
        pcVar10 = pcVar8;
      }
      else {
        fmt = "MAIL FROM:%s AUTH=%s";
        pcVar10 = pcVar7;
      }
      CVar5 = Curl_pp_sendf(&(pp->ftpc).pp,fmt,pcVar13,pcVar10);
      connected = SUB81(fmt,0);
    }
LAB_00135c65:
    (*Curl_cfree)(pcVar13);
    (*Curl_cfree)(pcVar7);
    (*Curl_cfree)(pcVar8);
    if (CVar5 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_SELECT;
    }
    goto LAB_00135c90;
  }
  CVar5 = smtp_perform_command(conn);
LAB_00135c90:
  if (CVar5 == CURLE_OK) {
    p_Var12 = done;
    CVar5 = smtp_multi_statemach(conn,done);
    connected = SUB81(p_Var12,0);
  }
  if ((CVar5 == CURLE_OK) && (CVar5 = CURLE_OK, *done == true)) {
    smtp_dophase_done(conn,(_Bool)connected);
  }
  return CVar5;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}